

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::WhiteRoomOne(ItemTable *this)

{
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_1e8 [5];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  Item local_1b0;
  ItemWrapper *local_188;
  ItemWrapper *Ladder;
  string local_178 [32];
  Item local_158;
  ItemWrapper *local_130;
  ItemWrapper *LPiller;
  string local_120 [32];
  Item local_100;
  ItemWrapper *local_d8;
  ItemWrapper *Torch;
  string local_c8 [32];
  Item local_a8;
  ItemWrapper *local_80;
  ItemWrapper *PowerCrystal;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *Discus;
  ItemTable *this_local;
  
  Discus = (ItemWrapper *)this;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  PowerCrystal._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Disc",&local_61);
  Item::Item(&local_40,(string *)local_60,DISCUS);
  ItemWrapper::ItemWrapper(pIVar1,&local_40,W_ROOM1);
  PowerCrystal._3_1_ = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_18 = pIVar1;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  Torch._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"PowerCrystal",(allocator *)((long)&Torch + 7));
  Item::Item(&local_a8,(string *)local_c8,POWER_CRYSTAL);
  ItemWrapper::ItemWrapper(pIVar1,&local_a8,W_ROOM1);
  Torch._6_1_ = 0;
  Item::~Item(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Torch + 7));
  local_80 = pIVar1;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  LPiller._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"Torch",(allocator *)((long)&LPiller + 7));
  Item::Item(&local_100,(string *)local_120,TORCH);
  ItemWrapper::ItemWrapper(pIVar1,&local_100,W_ROOM1);
  LPiller._6_1_ = 0;
  Item::~Item(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&LPiller + 7));
  local_d8 = pIVar1;
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  Ladder._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"Light Pillar",(allocator *)((long)&Ladder + 7));
  Item::Item(&local_158,(string *)local_178,LIGHT_PILLAR);
  ItemWrapper::ItemWrapper(pIVar1,&local_158,W_ROOM1);
  Ladder._6_1_ = 0;
  Item::~Item(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Ladder + 7));
  local_130 = pIVar1;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  local_1d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"Ladder",&local_1d1);
  Item::Item(&local_1b0,(string *)local_1d0,LADDER);
  ItemWrapper::ItemWrapper(pIVar2,&local_1b0,HIDDEN);
  local_1d2 = 0;
  Item::~Item(&local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pIVar1 = local_18;
  local_1e8[4] = 0x29;
  local_188 = pIVar2;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_1e8 + 4);
  pIVar2 = local_80;
  *ppIVar3 = pIVar1;
  local_1e8[3] = 0x2a;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_1e8 + 3);
  pIVar1 = local_d8;
  *ppIVar3 = pIVar2;
  local_1e8[2] = 0x1e;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_1e8 + 2);
  pIVar2 = local_130;
  *ppIVar3 = pIVar1;
  local_1e8[1] = 0x2b;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_1e8 + 1);
  pIVar1 = local_188;
  *ppIVar3 = pIVar2;
  local_1e8[0] = LADDER;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_1e8);
  *ppIVar3 = pIVar1;
  return;
}

Assistant:

void ItemTable::WhiteRoomOne() {
    //    DISCUS, POWER_CRYSTAL, TORCH, LIGHT_PILLAR,

    ItemWrapper * Discus         = new ItemWrapper(Item("Disc", DISCUS), W_ROOM1);
    ItemWrapper * PowerCrystal   = new ItemWrapper(Item("PowerCrystal", POWER_CRYSTAL), W_ROOM1);
    ItemWrapper * Torch          = new ItemWrapper(Item("Torch", TORCH), W_ROOM1);
    ItemWrapper * LPiller        = new ItemWrapper(Item("Light Pillar", LIGHT_PILLAR), W_ROOM1);
    ItemWrapper * Ladder         = new ItemWrapper(Item("Ladder", LADDER), HIDDEN);

    items[DISCUS] = Discus;
    items[POWER_CRYSTAL] = PowerCrystal;
    items[TORCH] = Torch;
    items[LIGHT_PILLAR] = LPiller;
    items[LADDER] = Ladder;
}